

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

string * glcts::anon_unknown_0::ShaderSourceFactory::generateVertexShader
                   (string *__return_storage_ptr__,ShaderKey *key,
                   vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   *uniforms,
                   vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                   *subroutineUniforms,string *additionalDef,ContextType type)

{
  ostream *poVar1;
  undefined1 local_1b0 [8];
  ostringstream ret;
  string *additionalDef_local;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  *subroutineUniforms_local;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  *uniforms_local;
  ShaderKey *key_local;
  ContextType type_local;
  
  ret._368_8_ = additionalDef;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  streamShaderHeader((ostringstream *)local_1b0,type);
  std::operator<<((ostream *)local_1b0,"\n");
  streamUniformDefinitions(uniforms,0x8b31,(ostringstream *)local_1b0);
  std::operator<<((ostream *)local_1b0,"\n");
  streamSubroutineDefinitions(subroutineUniforms,0x8b31,(ostringstream *)local_1b0);
  poVar1 = std::operator<<((ostream *)local_1b0,"\n");
  poVar1 = std::operator<<(poVar1,(string *)ret._368_8_);
  poVar1 = std::operator<<(poVar1,"\nin vec4 in_Position;");
  poVar1 = std::operator<<(poVar1,"\nout vec4 ");
  poVar1 = std::operator<<(poVar1,(string *)&key->output);
  poVar1 = std::operator<<(poVar1,";");
  poVar1 = std::operator<<(poVar1,"\nvoid main() {");
  poVar1 = std::operator<<(poVar1,"\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);");
  std::operator<<(poVar1,"\n");
  streamUniformValidators((ostringstream *)local_1b0,uniforms,0x8b31,"validationResult");
  std::operator<<((ostream *)local_1b0,"\n");
  streamSubroutineValidators
            ((ostringstream *)local_1b0,subroutineUniforms,0x8b31,"validationResult");
  poVar1 = std::operator<<((ostream *)local_1b0,"\n    ");
  poVar1 = std::operator<<(poVar1,(string *)&key->output);
  poVar1 = std::operator<<(poVar1," = validationResult;");
  poVar1 = std::operator<<(poVar1,"\n    gl_Position = in_Position;");
  std::operator<<(poVar1,"\n}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

static std::string generateVertexShader(const ShaderKey& key, const std::vector<Uniform>& uniforms,
											const std::vector<SubroutineUniform>& subroutineUniforms,
											const std::string& additionalDef, const glu::ContextType type)
	{

		std::ostringstream ret;
		streamShaderHeader(ret, type);
		ret << NL;
		streamUniformDefinitions(uniforms, GL_VERTEX_SHADER, ret);
		ret << NL;
		streamSubroutineDefinitions(subroutineUniforms, GL_VERTEX_SHADER, ret);
		ret << NL << additionalDef << NL "in vec4 in_Position;" << NL "out vec4 " << key.output << ";"
			<< NL "void main() {" << NL "    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);" << NL;
		streamUniformValidators(ret, uniforms, GL_VERTEX_SHADER, "validationResult");
		ret << NL;
		streamSubroutineValidators(ret, subroutineUniforms, GL_VERTEX_SHADER, "validationResult");
		ret << NL "    " << key.output << " = validationResult;" << NL "    gl_Position = in_Position;" << NL "}";
		return ret.str();
	}